

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O1

int tnt_schema_add_spaces(tnt_schema *schema_obj,tnt_reply *r)

{
  ushort *puVar1;
  byte bVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  tnt_schema_sval *ptVar8;
  char *__dest;
  mh_assoc_t *pmVar9;
  undefined8 *puVar10;
  void *pvVar11;
  uint8_t val;
  uint uVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  uint len;
  assoc_val ***ret;
  assoc_val ***ret_00;
  assoc_val ***ret_01;
  assoc_val ***ret_02;
  uint uVar16;
  ulong uVar17;
  assoc_val *paVar18;
  assoc_val **ppaVar19;
  uint *node;
  long *plVar20;
  byte **data;
  undefined8 *puVar21;
  undefined8 *ptr;
  tnt_schema_sval *val_00;
  uint uVar22;
  mh_assoc_t *pmVar23;
  mp_type *k;
  assoc_val *paVar24;
  assoc_val *paVar25;
  byte *pbVar26;
  byte *pbVar27;
  assoc_val *paStack_a8;
  assoc_val *paStack_a0;
  uint uStack_94;
  byte *pbStack_90;
  ulong uStack_88;
  int8_t *piStack_80;
  tnt_schema_sval *ptStack_78;
  tnt_schema_sval *ptStack_70;
  assoc_val *paStack_68;
  code *pcStack_60;
  mh_assoc_t *local_58;
  assoc_val *local_50;
  assoc_val *space_string;
  assoc_val *space_number;
  char *tuple;
  
  pmVar23 = schema_obj->space_hash;
  space_number = (assoc_val *)r->data;
  paVar18 = (assoc_val *)r->data_end;
  pcStack_60 = (code *)0x1069af;
  iVar5 = mp_check((char **)&space_number,(char *)paVar18);
  if (iVar5 != 0) {
    return -1;
  }
  pbVar26 = (byte *)r->data;
  bVar2 = *pbVar26;
  k = mp_type_hint;
  if (mp_type_hint[bVar2] != MP_ARRAY) {
    return -1;
  }
  space_number = (assoc_val *)(pbVar26 + 1);
  if ((bVar2 & 0x40) == 0) {
    uVar17 = (ulong)(bVar2 & 0xf);
  }
  else {
    if ((bVar2 & 1) == 0) goto LAB_00106dd9;
    uVar6 = *(uint *)(pbVar26 + 1);
    uVar17 = (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
                    );
    space_number = (assoc_val *)(pbVar26 + 5);
  }
LAB_001069ef:
  local_58 = pmVar23;
  if ((int)uVar17 == 0) {
    return 0;
  }
  do {
    local_50 = (assoc_val *)0x0;
    space_string = (assoc_val *)0x0;
    tuple = (char *)space_number;
    bVar2 = *(byte *)&(space_number->key).id;
    val_00 = (tnt_schema_sval *)0x0;
    if (*(int *)((long)&(((assoc_val *)k)->key).id + (ulong)bVar2 * 4) != 5) {
LAB_00106d0f:
      lVar13 = 1;
      goto LAB_00106d19;
    }
    tuple = (char *)((long)&(space_number->key).id + 1);
    if ((bVar2 & 0x40) != 0) {
      if ((bVar2 & 1) == 0) {
        tuple = (char *)((long)&(space_number->key).id + 3);
      }
      else {
        tuple = (char *)((long)&(space_number->key).id + 5);
      }
    }
    plVar20 = (long *)0x18;
    pcStack_60 = (code *)0x106a40;
    ptVar8 = (tnt_schema_sval *)tnt_mem_alloc(0x18);
    if (ptVar8 == (tnt_schema_sval *)0x0) goto LAB_00106d0f;
    ptVar8->name = (char *)0x0;
    ptVar8->name_len = 0;
    ptVar8->number = 0;
    ptVar8->index = (mh_assoc_t *)0x0;
    bVar2 = *tuple;
    uVar6 = (uint)bVar2;
    val_00 = ptVar8;
    if (*(int *)((long)&(((assoc_val *)k)->key).id + (ulong)bVar2 * 4) != 1) goto LAB_00106d0f;
    pcVar15 = tuple + 1;
    switch(bVar2) {
    case 0xcc:
      uVar6 = (uint)(byte)tuple[1];
      tuple = tuple + 2;
      break;
    case 0xcd:
      puVar1 = (ushort *)(tuple + 1);
      tuple = tuple + 3;
      uVar6 = (uint)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
      break;
    case 0xce:
      uVar6 = *(uint *)(tuple + 1);
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      tuple = tuple + 5;
      break;
    case 0xcf:
      uVar3 = *(undefined8 *)(tuple + 1);
      uVar6 = (uint)(byte)((ulong)uVar3 >> 0x38) | ((uint)((ulong)uVar3 >> 0x20) & 0xff0000) >> 8 |
              (uint)((ulong)uVar3 >> 0x18) & 0xff0000 | (uint)((ulong)uVar3 >> 8) & 0xff000000;
      tuple = tuple + 9;
      break;
    default:
      tuple = pcVar15;
      if ((char)bVar2 < '\0') {
        pcStack_60 = tnt_schema_add_indexes;
        tnt_schema_add_spaces_cold_2();
        piStack_80 = "";
        plVar20 = (long *)*plVar20;
        pbStack_90 = (byte *)paVar18[3].key.id;
        data = &pbStack_90;
        node = *(uint **)&paVar18[3].key.id_len;
        uStack_88 = uVar17;
        ptStack_78 = ptVar8;
        ptStack_70 = ptVar8;
        paStack_68 = (assoc_val *)k;
        pcStack_60 = (code *)&stack0xfffffffffffffff8;
        iVar5 = mp_check((char **)data,(char *)node);
        if (iVar5 != 0) {
          return -1;
        }
        pbVar26 = (byte *)paVar18[3].key.id;
        bVar2 = *pbVar26;
        if (mp_type_hint[bVar2] != MP_ARRAY) {
          return -1;
        }
        pbStack_90 = pbVar26 + 1;
        if ((bVar2 & 0x40) == 0) {
          uVar6 = bVar2 & 0xf;
        }
        else if ((bVar2 & 1) == 0) {
          pbStack_90 = pbVar26 + 3;
          uVar6 = (uint)(ushort)(*(ushort *)(pbVar26 + 1) << 8 | *(ushort *)(pbVar26 + 1) >> 8);
        }
        else {
          uVar6 = *(uint *)(pbVar26 + 1);
          uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          pbStack_90 = pbVar26 + 5;
        }
        if (uVar6 == 0) {
          return 0;
        }
        puVar21 = (undefined8 *)0x0;
        goto LAB_00106e6b;
      }
    }
    uVar16 = (int)uVar17 - 1;
    uVar17 = (ulong)uVar16;
    pmVar23 = (mh_assoc_t *)&ptVar8->number;
    ptVar8->number = uVar6;
    k = (mp_type *)0x1;
    do {
      paVar18 = (assoc_val *)(tuple + 1);
      lVar13 = (long)""[(byte)*tuple];
      if (lVar13 < 0) {
        if (*tuple == 0xd9) {
          tuple = tuple + (ulong)(byte)tuple[1] + 2;
          goto LAB_00106b06;
        }
        if (-0x20 < ""[(byte)*tuple]) {
          k = (mp_type *)((long)k - lVar13);
          tuple = (char *)paVar18;
          goto LAB_00106b06;
        }
        pcStack_60 = (code *)0x106b4b;
        paVar18 = (assoc_val *)k;
        mp_next_slowpath(&tuple,(int64_t)k);
        bVar4 = false;
        paVar24 = (assoc_val *)k;
      }
      else {
        paVar18 = (assoc_val *)((long)&(paVar18->key).id + lVar13);
        tuple = (char *)paVar18;
LAB_00106b06:
        bVar4 = true;
        paVar24 = (assoc_val *)k;
      }
      k = (mp_type *)paVar24;
    } while ((bVar4) && (k = (mp_type *)((long)&paVar24[-1].data + 7), 1 < (long)paVar24));
    bVar2 = *tuple;
    if (mp_type_hint[bVar2] != MP_STR) goto LAB_00106d0f;
    if (bVar2 == 0xdb) {
      uVar6 = *(uint *)(tuple + 1);
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      tuple = tuple + 5;
    }
    else if (bVar2 == 0xda) {
      puVar1 = (ushort *)(tuple + 1);
      tuple = tuple + 3;
      uVar6 = (uint)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
    }
    else if (bVar2 == 0xd9) {
      uVar6 = (uint)(byte)tuple[1];
      tuple = tuple + 2;
    }
    else {
      pbVar26 = (byte *)(ulong)(bVar2 + 0x40);
      if ((byte)(bVar2 + 0x40) < 0xe0) goto LAB_00106dd4;
      uVar6 = bVar2 & 0x1f;
      tuple = tuple + 1;
    }
    pcVar15 = tuple;
    ptVar8->name_len = uVar6;
    tuple = tuple + uVar6;
    pcStack_60 = (code *)0x106bd8;
    __dest = (char *)tnt_mem_alloc((ulong)uVar6);
    ptVar8->name = __dest;
    if (__dest == (char *)0x0) goto LAB_00106d0f;
    pcStack_60 = (code *)0x106bf4;
    memcpy(__dest,pcVar15,(ulong)ptVar8->name_len);
    pcStack_60 = (code *)0x106bfb;
    pmVar9 = mh_assoc_new();
    ptVar8->index = pmVar9;
    if (pmVar9 == (mh_assoc_t *)0x0) goto LAB_00106d0f;
    pcStack_60 = (code *)0x106c12;
    local_50 = (assoc_val *)tnt_mem_alloc(0x18);
    if (local_50 == (assoc_val *)0x0) goto LAB_00106d0f;
    (local_50->key).id = ptVar8->name;
    pvVar11 = (void *)(ulong)ptVar8->name_len;
    (local_50->key).id_len = ptVar8->name_len;
    local_50->data = ptVar8;
    pcStack_60 = (code *)0x106c3b;
    space_string = (assoc_val *)tnt_mem_alloc(0x18);
    pmVar9 = local_58;
    if (space_string == (assoc_val *)0x0) goto LAB_00106d0f;
    (space_string->key).id = (char *)pmVar23;
    (space_string->key).id_len = 4;
    space_string->data = ptVar8;
    pcStack_60 = (code *)0x106c66;
    mh_assoc_put(local_58,&local_50,ret,pvVar11);
    pcStack_60 = (code *)0x106c72;
    mh_assoc_put(pmVar9,&space_string,ret_00,pvVar11);
    paVar24 = (assoc_val *)0x1;
    do {
      bVar2 = *(byte *)&(space_number->key).id;
      paVar18 = (assoc_val *)((long)&(space_number->key).id + 1);
      lVar13 = (long)""[bVar2];
      if (lVar13 < 0) {
        if (bVar2 == 0xd9) {
          space_number = (assoc_val *)
                         ((long)&(space_number->key).id +
                         (ulong)*(byte *)((long)&(space_number->key).id + 1) + 2);
          goto LAB_00106c98;
        }
        if (-0x20 < ""[bVar2]) {
          paVar24 = (assoc_val *)((long)paVar24 - lVar13);
          space_number = paVar18;
          goto LAB_00106c98;
        }
        pcStack_60 = (code *)0x106cdd;
        paVar18 = paVar24;
        mp_next_slowpath((char **)&space_number,(int64_t)paVar24);
        bVar4 = false;
        paVar25 = paVar24;
      }
      else {
        paVar18 = (assoc_val *)((long)&(paVar18->key).id + lVar13);
        space_number = paVar18;
LAB_00106c98:
        bVar4 = true;
        paVar25 = paVar24;
      }
    } while ((bVar4) && (paVar24 = (assoc_val *)((long)&paVar25[-1].data + 7), 1 < (long)paVar25));
    k = mp_type_hint;
    if (uVar16 == 0) {
      return 0;
    }
  } while( true );
LAB_00106e6b:
  paStack_a8 = (assoc_val *)0x0;
  paStack_a0 = (assoc_val *)0x0;
  bVar2 = *pbStack_90;
  ptr = puVar21;
  if (mp_type_hint[bVar2] != MP_ARRAY) {
LAB_00107157:
    lVar13 = 1;
    goto LAB_00107167;
  }
  if ((bVar2 & 0x40) == 0) {
    pbVar26 = pbStack_90 + 1;
  }
  else if ((bVar2 & 1) == 0) {
    pbVar26 = pbStack_90 + 3;
  }
  else {
    pbVar26 = pbStack_90 + 5;
  }
  bVar2 = *pbVar26;
  uVar16 = (uint)bVar2;
  switch(bVar2) {
  case 0xcc:
    uVar16 = (uint)pbVar26[1];
    pbVar27 = pbVar26 + 2;
    break;
  case 0xcd:
    pbVar27 = pbVar26 + 3;
    uVar16 = (uint)(ushort)(*(ushort *)(pbVar26 + 1) << 8 | *(ushort *)(pbVar26 + 1) >> 8);
    break;
  case 0xce:
    uVar16 = *(uint *)(pbVar26 + 1);
    uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
    pbVar27 = pbVar26 + 5;
    break;
  case 0xcf:
    uVar3 = *(undefined8 *)(pbVar26 + 1);
    uVar16 = (uint)(byte)((ulong)uVar3 >> 0x38) | ((uint)((ulong)uVar3 >> 0x20) & 0xff0000) >> 8 |
             (uint)((ulong)uVar3 >> 0x18) & 0xff0000 | (uint)((ulong)uVar3 >> 8) & 0xff000000;
    pbVar27 = pbVar26 + 9;
    break;
  default:
    if (-1 < (char)bVar2) {
      pbVar27 = pbVar26 + 1;
      break;
    }
    goto LAB_00107249;
  }
  uStack_94 = uVar16;
  if (mp_type_hint[*pbVar27] != MP_UINT) goto LAB_00107157;
  uVar6 = uVar6 - 1;
  uVar7 = PMurHash32(0xd,&uStack_94,4);
  uVar16 = *(uint *)(plVar20 + 2);
  ppaVar19 = (assoc_val **)((ulong)uVar7 % (ulong)uVar16);
  while( true ) {
    uVar22 = *(uint *)(plVar20[1] + ((ulong)ppaVar19 >> 4) * 4);
    uVar12 = (uint)ppaVar19 & 0xf;
    if ((((uVar22 >> uVar12 & 1) != 0) &&
        (puVar10 = *(undefined8 **)(*plVar20 + (long)ppaVar19 * 8), *(int *)(puVar10 + 1) == 4)) &&
       (uStack_94 == *(uint *)*puVar10)) goto LAB_00106f7f;
    if (((uVar22 >> (sbyte)uVar12) >> 0x10 & 1) == 0) break;
    uVar12 = (uint)ppaVar19 + uVar7 % (uVar16 - 1) + 1;
    uVar22 = uVar16;
    if (uVar12 < uVar16) {
      uVar22 = 0;
    }
    ppaVar19 = (assoc_val **)(ulong)(uVar12 - uVar22);
  }
  ppaVar19 = (assoc_val **)(ulong)uVar16;
LAB_00106f7f:
  if ((uint)ppaVar19 == uVar16) {
    return -1;
  }
  lVar13 = *(long *)(*(long *)(*plVar20 + (long)ppaVar19 * 8) + 0x10);
  data = (byte **)0x10;
  puVar10 = (undefined8 *)tnt_mem_alloc(0x10);
  if (puVar10 == (undefined8 *)0x0) goto LAB_00107157;
  *puVar10 = 0;
  puVar10[1] = 0;
  bVar2 = *pbVar27;
  uVar16 = (uint)bVar2;
  ptr = puVar10;
  if (mp_type_hint[bVar2] != MP_UINT) goto LAB_00107157;
  node = &switchD_00106fe3::switchdataD_001193c0;
  switch(bVar2) {
  case 0xcc:
    uVar16 = (uint)pbVar27[1];
    pbVar26 = pbVar27 + 2;
    break;
  case 0xcd:
    pbVar26 = pbVar27 + 3;
    uVar16 = (uint)(ushort)(*(ushort *)(pbVar27 + 1) << 8 | *(ushort *)(pbVar27 + 1) >> 8);
    break;
  case 0xce:
    uVar16 = *(uint *)(pbVar27 + 1);
    uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
    pbVar26 = pbVar27 + 5;
    break;
  case 0xcf:
    uVar3 = *(undefined8 *)(pbVar27 + 1);
    uVar16 = (uint)(byte)((ulong)uVar3 >> 0x38) | ((uint)((ulong)uVar3 >> 0x20) & 0xff0000) >> 8 |
             (uint)((ulong)uVar3 >> 0x18) & 0xff0000 | (uint)((ulong)uVar3 >> 8) & 0xff000000;
    pbVar26 = pbVar27 + 9;
    break;
  default:
    node = (uint *)ppaVar19;
    if ((char)bVar2 < '\0') goto LAB_0010724e;
    pbVar26 = pbVar27 + 1;
  }
  *(uint *)((long)puVar10 + 0xc) = uVar16;
  bVar2 = *pbVar26;
  if (mp_type_hint[bVar2] != MP_STR) goto LAB_00107157;
  if (bVar2 == 0xdb) {
    uVar16 = *(uint *)(pbVar26 + 1);
    uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
    pbVar27 = pbVar26 + 5;
  }
  else if (bVar2 == 0xda) {
    pbVar27 = pbVar26 + 3;
    uVar16 = (uint)(ushort)(*(ushort *)(pbVar26 + 1) << 8 | *(ushort *)(pbVar26 + 1) >> 8);
  }
  else if (bVar2 == 0xd9) {
    uVar16 = (uint)pbVar26[1];
    pbVar27 = pbVar26 + 2;
  }
  else {
    if ((byte)(bVar2 + 0x40) < 0xe0) {
      tnt_schema_add_indexes_cold_1();
LAB_00107249:
      tnt_schema_add_indexes_cold_3();
LAB_0010724e:
      tnt_schema_add_indexes_cold_2();
      pbVar26 = *data;
      uVar7 = PMurHash32(0xd,node,len);
      uVar6 = *(uint *)(pbVar26 + 0x10);
      uVar17 = (ulong)uVar7 % (ulong)uVar6;
      lVar13 = *(long *)(pbVar26 + 8);
      while( true ) {
        uVar22 = (uint)uVar17;
        uVar16 = *(uint *)(lVar13 + (uVar17 >> 4) * 4);
        if (((((uVar16 >> (uVar22 & 0xf) & 1) != 0) &&
             (puVar21 = *(undefined8 **)(*(long *)pbVar26 + uVar17 * 8),
             *(uint *)(puVar21 + 1) == len)) &&
            (iVar5 = bcmp(node,(void *)*puVar21,(ulong)len), uVar12 = uVar22, iVar5 == 0)) ||
           (uVar12 = uVar6, ((uVar16 >> (sbyte)(uVar22 & 0xf)) >> 0x10 & 1) == 0)) break;
        uVar22 = uVar22 + uVar7 % (uVar6 - 1) + 1;
        uVar16 = uVar6;
        if (uVar22 < uVar6) {
          uVar16 = 0;
        }
        uVar17 = (ulong)(uVar22 - uVar16);
      }
      iVar5 = -1;
      if (uVar12 != uVar6) {
        iVar5 = *(int *)(*(long *)(*(long *)(*(long *)pbVar26 + (ulong)uVar12 * 8) + 0x10) + 0xc);
      }
      return iVar5;
    }
    pbVar27 = pbVar26 + 1;
    uVar16 = bVar2 & 0x1f;
  }
  *(uint *)(puVar10 + 1) = uVar16;
  pvVar11 = tnt_mem_alloc((ulong)uVar16);
  *puVar10 = pvVar11;
  if (pvVar11 == (void *)0x0) goto LAB_00107157;
  memcpy(pvVar11,pbVar27,(ulong)*(uint *)(puVar10 + 1));
  paStack_a0 = (assoc_val *)tnt_mem_alloc(0x18);
  if (paStack_a0 == (assoc_val *)0x0) goto LAB_00107157;
  (paStack_a0->key).id = (char *)*puVar10;
  (paStack_a0->key).id_len = *(uint32_t *)(puVar10 + 1);
  paStack_a0->data = puVar10;
  paStack_a8 = (assoc_val *)tnt_mem_alloc(0x18);
  if (paStack_a8 == (assoc_val *)0x0) goto LAB_00107157;
  pcVar15 = (char *)((long)puVar10 + 0xc);
  (paStack_a8->key).id = pcVar15;
  (paStack_a8->key).id_len = 4;
  paStack_a8->data = puVar10;
  mh_assoc_put(*(mh_assoc_t **)(lVar13 + 0x10),&paStack_a0,ret_01,pcVar15);
  node = (uint *)&paStack_a8;
  mh_assoc_put(*(mh_assoc_t **)(lVar13 + 0x10),(assoc_val **)node,ret_02,pcVar15);
  data = &pbStack_90;
  mp_next((char **)data);
  if (uVar6 == 0) {
    return 0;
  }
  goto LAB_00106e6b;
LAB_00107167:
  lVar14 = (long)""[*pbStack_90];
  if (lVar14 < 0) {
    if (*pbStack_90 == 0xd9) {
      pbStack_90 = pbStack_90 + (ulong)pbStack_90[1] + 2;
      goto LAB_00107187;
    }
    if (-0x20 < ""[*pbStack_90]) {
      lVar13 = lVar13 - lVar14;
      pbStack_90 = pbStack_90 + 1;
      goto LAB_00107187;
    }
    mp_next_slowpath((char **)&pbStack_90,lVar13);
    bVar4 = false;
    lVar14 = lVar13;
  }
  else {
    pbStack_90 = pbStack_90 + 1 + lVar14;
LAB_00107187:
    bVar4 = true;
    lVar14 = lVar13;
  }
  if ((!bVar4) || (lVar13 = lVar14 + -1, lVar14 < 2)) {
    if (paStack_a0 != (assoc_val *)0x0) {
      tnt_mem_free(paStack_a0);
    }
    if (paStack_a8 != (assoc_val *)0x0) {
      tnt_mem_free(paStack_a8);
    }
    if (ptr != (undefined8 *)0x0) {
      tnt_mem_free((void *)*ptr);
    }
    tnt_mem_free(ptr);
    return -1;
  }
  goto LAB_00107167;
LAB_00106dd4:
  pcStack_60 = (code *)0x106dd9;
  tuple = tuple + 1;
  tnt_schema_add_spaces_cold_1();
LAB_00106dd9:
  space_number = (assoc_val *)(pbVar26 + 3);
  uVar17 = (ulong)(ushort)(*(ushort *)(pbVar26 + 1) << 8 | *(ushort *)(pbVar26 + 1) >> 8);
  goto LAB_001069ef;
LAB_00106d19:
  bVar2 = *(byte *)&(space_number->key).id;
  paVar18 = (assoc_val *)((long)&(space_number->key).id + 1);
  lVar14 = (long)""[bVar2];
  if (lVar14 < 0) {
    if (bVar2 == 0xd9) {
      space_number = (assoc_val *)
                     ((long)&(space_number->key).id +
                     (ulong)*(byte *)((long)&(space_number->key).id + 1) + 2);
      goto LAB_00106d39;
    }
    if (-0x20 < ""[bVar2]) {
      lVar13 = lVar13 - lVar14;
      space_number = paVar18;
      goto LAB_00106d39;
    }
    pcStack_60 = (code *)0x106d7d;
    mp_next_slowpath((char **)&space_number,lVar13);
    bVar4 = false;
    lVar14 = lVar13;
  }
  else {
    space_number = (assoc_val *)((long)&(paVar18->key).id + lVar14);
LAB_00106d39:
    bVar4 = true;
    lVar14 = lVar13;
  }
  if ((!bVar4) || (lVar13 = lVar14 + -1, lVar14 < 2)) {
    pcStack_60 = (code *)0x106d89;
    tnt_schema_sval_free(val_00);
    if (local_50 != (assoc_val *)0x0) {
      pcStack_60 = (code *)0x106d97;
      tnt_mem_free(local_50);
    }
    if (space_string != (assoc_val *)0x0) {
      pcStack_60 = (code *)0x106da5;
      tnt_mem_free(space_string);
    }
    return -1;
  }
  goto LAB_00106d19;
}

Assistant:

int tnt_schema_add_spaces(struct tnt_schema *schema_obj, struct tnt_reply *r) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	const char *tuple = r->data;
	if (mp_check(&tuple, tuple + (r->data_end - r->data)))
		return -1;
	tuple = r->data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		return -1;
	uint32_t space_count = mp_decode_array(&tuple);
	while (space_count-- > 0) {
		if (tnt_schema_add_space(schema, &tuple))
			return -1;
	}
	return 0;
}